

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O2

void __thiscall FM::OPN::Reset(OPN *this)

{
  int i;
  uint uVar1;
  
  for (uVar1 = 0x20; uVar1 != 0x28; uVar1 = uVar1 + 1) {
    SetReg(this,uVar1,0);
  }
  for (uVar1 = 0x30; uVar1 != 0xc0; uVar1 = uVar1 + 1) {
    SetReg(this,uVar1,0);
  }
  OPNBase::Reset(&this->super_OPNBase);
  Channel4::Reset((Channel4 *)&this->field_0x1d8);
  Channel4::Reset((Channel4 *)&this->field_0x4b8);
  Channel4::Reset((Channel4 *)&this->field_0x798);
  return;
}

Assistant:

void OPN::Reset()
{
	int i;
	for (i=0x20; i<0x28; i++) SetReg(i, 0);
	for (i=0x30; i<0xc0; i++) SetReg(i, 0);
	OPNBase::Reset();
	ch[0].Reset();
	ch[1].Reset();
	ch[2].Reset();
}